

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptFullySpecifiedType
          (HlslGrammar *this,TType *type,TIntermNode **nodeList,TAttributes *attributes,
          bool forbidDeclarators)

{
  HlslParseContext *this_00;
  bool bVar1;
  int iVar2;
  EHlslTokenClass EVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_a0 [8];
  TSourceLoc loc;
  TQualifier qualifier;
  bool forbidDeclarators_local;
  TAttributes *attributes_local;
  TIntermNode **nodeList_local;
  TType *type_local;
  HlslGrammar *this_local;
  
  TQualifier::clear((TQualifier *)&loc.column);
  bVar1 = acceptPreQualifier(this,(TQualifier *)&loc.column);
  if (bVar1) {
    local_a0 = (undefined1  [8])(this->super_HlslTokenStream).token.loc.name;
    loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
    loc.string = (this->super_HlslTokenStream).token.loc.column;
    loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    bVar1 = acceptType(this,type,nodeList);
    if (bVar1) {
      bVar1 = acceptPostQualifier(this,(TQualifier *)&loc.column);
      if (bVar1) {
        iVar2 = (*type->_vptr_TType[7])();
        if (iVar2 == 0x10) {
          this_00 = this->parseContext;
          iVar2 = (*type->_vptr_TType[10])();
          HlslParseContext::mergeQualifiers
                    (this_00,(TQualifier *)CONCAT44(extraout_var,iVar2),(TQualifier *)&loc.column);
          HlslParseContext::transferTypeAttributes
                    (this->parseContext,&(this->super_HlslTokenStream).token.loc,attributes,type,
                     false);
          if ((forbidDeclarators) ||
             (EVar3 = HlslTokenStream::peek(&this->super_HlslTokenStream), EVar3 != EHTokIdentifier)
             ) {
            HlslParseContext::declareBlock
                      (this->parseContext,(TSourceLoc *)local_a0,type,(TString *)0x0);
          }
        }
        else {
          if (qualifier._36_1_ != '\0') {
            __assert_fail("qualifier.layoutFormat == ElfNone",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                          ,0x285,
                          "bool glslang::HlslGrammar::acceptFullySpecifiedType(TType &, TIntermNode *&, const TAttributes &, bool)"
                         );
          }
          (*type->_vptr_TType[10])();
          (*type->_vptr_TType[10])();
          iVar2 = (*type->_vptr_TType[10])();
          if ((((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) == 0x11) ||
             (iVar2 = (*type->_vptr_TType[10])(),
             ((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0x7f) == 6)) {
            (*type->_vptr_TType[10])();
            (*type->_vptr_TType[10])();
          }
          uVar4 = (*type->_vptr_TType[0x29])();
          if ((uVar4 & 1) != 0) {
            (*type->_vptr_TType[10])();
          }
          iVar2 = (*type->_vptr_TType[10])();
          memcpy((void *)CONCAT44(extraout_var_02,iVar2),&loc.column,0x50);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      if (((ulong)qualifier.semanticName >> 0x2d & 1) != 0) {
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptFullySpecifiedType(TType& type, TIntermNode*& nodeList, const TAttributes& attributes, bool forbidDeclarators)
{
    // type_qualifier
    TQualifier qualifier;
    qualifier.clear();
    if (! acceptPreQualifier(qualifier))
        return false;
    TSourceLoc loc = token.loc;

    // type_specifier
    if (! acceptType(type, nodeList)) {
        // If this is not a type, we may have inadvertently gone down a wrong path
        // by parsing "sample", which can be treated like either an identifier or a
        // qualifier.  Back it out, if we did.
        if (qualifier.sample)
            recedeToken();

        return false;
    }

    // type_qualifier
    if (! acceptPostQualifier(qualifier))
       return false;

    if (type.getBasicType() == EbtBlock) {
        // the type was a block, which set some parts of the qualifier
        parseContext.mergeQualifiers(type.getQualifier(), qualifier);
    
        // merge in the attributes
        parseContext.transferTypeAttributes(token.loc, attributes, type);

        // further, it can create an anonymous instance of the block
        // (cbuffer and tbuffer don't consume the next identifier, and
        // should set forbidDeclarators)
        if (forbidDeclarators || peek() != EHTokIdentifier)
            parseContext.declareBlock(loc, type);
    } else {
        // Some qualifiers are set when parsing the type.  Merge those with
        // whatever comes from acceptPreQualifier and acceptPostQualifier.
        assert(qualifier.layoutFormat == ElfNone);

        qualifier.layoutFormat = type.getQualifier().layoutFormat;
        qualifier.precision    = type.getQualifier().precision;

        if (type.getQualifier().storage == EvqOut ||
            type.getQualifier().storage == EvqBuffer) {
            qualifier.storage      = type.getQualifier().storage;
            qualifier.readonly     = type.getQualifier().readonly;
        }

        if (type.isBuiltIn())
            qualifier.builtIn = type.getQualifier().builtIn;

        type.getQualifier() = qualifier;
    }

    return true;
}